

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeMoveto(BtCursor *pCur,void *pKey,i64 nKey,int bias,int *pRes)

{
  KeyInfo *pKeyInfo_00;
  UnpackedRecord *p;
  KeyInfo *pKeyInfo;
  UnpackedRecord *pIdxKey;
  int rc;
  int *pRes_local;
  int bias_local;
  i64 nKey_local;
  void *pKey_local;
  BtCursor *pCur_local;
  
  if (pKey == (void *)0x0) {
    pIdxKey._4_4_ = sqlite3BtreeTableMoveto(pCur,nKey,bias,pRes);
  }
  else {
    pKeyInfo_00 = pCur->pKeyInfo;
    p = sqlite3VdbeAllocUnpackedRecord(pKeyInfo_00);
    if (p == (UnpackedRecord *)0x0) {
      return 7;
    }
    sqlite3VdbeRecordUnpack(pKeyInfo_00,(int)nKey,pKey,p);
    if ((p->nField == 0) || (pKeyInfo_00->nAllField < p->nField)) {
      pIdxKey._4_4_ = sqlite3CorruptError(0x10861);
    }
    else {
      pIdxKey._4_4_ = sqlite3BtreeIndexMoveto(pCur,p,pRes);
    }
    sqlite3DbFree(pCur->pKeyInfo->db,p);
  }
  return pIdxKey._4_4_;
}

Assistant:

static int btreeMoveto(
  BtCursor *pCur,     /* Cursor open on the btree to be searched */
  const void *pKey,   /* Packed key if the btree is an index */
  i64 nKey,           /* Integer key for tables.  Size of pKey for indices */
  int bias,           /* Bias search to the high end */
  int *pRes           /* Write search results here */
){
  int rc;                    /* Status code */
  UnpackedRecord *pIdxKey;   /* Unpacked index key */

  if( pKey ){
    KeyInfo *pKeyInfo = pCur->pKeyInfo;
    assert( nKey==(i64)(int)nKey );
    pIdxKey = sqlite3VdbeAllocUnpackedRecord(pKeyInfo);
    if( pIdxKey==0 ) return SQLITE_NOMEM_BKPT;
    sqlite3VdbeRecordUnpack(pKeyInfo, (int)nKey, pKey, pIdxKey);
    if( pIdxKey->nField==0 || pIdxKey->nField>pKeyInfo->nAllField ){
      rc = SQLITE_CORRUPT_BKPT;
    }else{
      rc = sqlite3BtreeIndexMoveto(pCur, pIdxKey, pRes);
    }
    sqlite3DbFree(pCur->pKeyInfo->db, pIdxKey);
  }else{
    pIdxKey = 0;
    rc = sqlite3BtreeTableMoveto(pCur, nKey, bias, pRes);
  }
  return rc;
}